

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

void __thiscall
Enhedron::Impl::Impl_Assertion::CerrFailureHandler::fail
          (CerrFailureHandler *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  pointer pVVar1;
  ostream *poVar2;
  pointer pVVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Assert failed: ");
  poVar2 = std::operator<<(poVar2,(string *)expressionText);
  std::operator<<(poVar2,"\n");
  pVVar1 = (variableList->
           super__Vector_base<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pVVar3 = (variableList->
                super__Vector_base<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
                )._M_impl.super__Vector_impl_data._M_start; pVVar3 != pVVar1; pVVar3 = pVVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"    ");
    poVar2 = std::operator<<(poVar2,(string *)pVVar3);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::operator<<(poVar2,(string *)&pVVar3->value_);
    poVar2 = std::operator<<(poVar2,": in file ");
    poVar2 = std::operator<<(poVar2,(string *)&pVVar3->file_);
    poVar2 = std::operator<<(poVar2,", line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pVVar3->line_);
    std::operator<<(poVar2,"\n");
  }
  std::ostream::flush();
  std::terminate();
}

Assistant:

virtual void fail(optional<string> description, const string &expressionText, const vector <Variable> &variableList) override {
            cerr << "Assert failed: " << expressionText << "\n";

            for (const auto &variable : variableList) {
                cerr << "    " << variable.name() << " = " << variable.value() <<
                ": in file " << variable.file() << ", line " << variable.line() << "\n";
            }

            cerr.flush();

            #ifndef NDEBUG
                terminate();
            #endif
        }